

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O3

UBool udata_cleanup(void)

{
  long lVar1;
  
  if (gCommonDataCache != (UHashtable *)0x0) {
    uhash_close_63(gCommonDataCache);
    gCommonDataCache = (UHashtable *)0x0;
  }
  lVar1 = 0;
  LOCK();
  gCommonDataCacheInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  do {
    if (*(UDataMemory **)((long)gCommonICUDataArray + lVar1) == (UDataMemory *)0x0) break;
    udata_close_63(*(UDataMemory **)((long)gCommonICUDataArray + lVar1));
    *(undefined8 *)((long)gCommonICUDataArray + lVar1) = 0;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x50);
  LOCK();
  gHaveTriedToLoadCommonData.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return '\x01';
}

Assistant:

static UBool U_CALLCONV
udata_cleanup(void)
{
    int32_t i;

    if (gCommonDataCache) {             /* Delete the cache of user data mappings.  */
        uhash_close(gCommonDataCache);  /*   Table owns the contents, and will delete them. */
        gCommonDataCache = NULL;        /*   Cleanup is not thread safe.                */
    }
    gCommonDataCacheInitOnce.reset();

    for (i = 0; i < UPRV_LENGTHOF(gCommonICUDataArray) && gCommonICUDataArray[i] != NULL; ++i) {
        udata_close(gCommonICUDataArray[i]);
        gCommonICUDataArray[i] = NULL;
    }
    gHaveTriedToLoadCommonData = 0;

    return TRUE;                   /* Everything was cleaned up */
}